

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

wchar_t tty_cookedmode(EditLine *el)

{
  wchar_t wVar1;
  EditLine *el_local;
  
  if ((el->el_tty).t_mode == '\0') {
    el_local._4_4_ = L'\0';
  }
  else if ((el->el_flags & 4U) == 0) {
    wVar1 = tty_setty(el,L'\x01',&(el->el_tty).t_ex);
    if (wVar1 == L'\xffffffff') {
      el_local._4_4_ = L'\xffffffff';
    }
    else {
      (el->el_tty).t_mode = '\0';
      el_local._4_4_ = L'\0';
    }
  }
  else {
    el_local._4_4_ = L'\0';
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
tty_cookedmode(EditLine *el)
{				/* set tty in normal setup */

	if (el->el_tty.t_mode == EX_IO)
		return 0;

	if (el->el_flags & EDIT_DISABLED)
		return 0;

	if (tty_setty(el, TCSADRAIN, &el->el_tty.t_ex) == -1) {
#ifdef DEBUG_TTY
		(void) fprintf(el->el_errfile, "%s: tty_setty: %s\n", __func__,
		    strerror(errno));
#endif /* DEBUG_TTY */
		return -1;
	}
	el->el_tty.t_mode = EX_IO;
	return 0;
}